

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void nni_sha1_update(nni_sha1_ctx *ctx,void *data,size_t length)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *local_28;
  uint8_t *msg;
  size_t length_local;
  void *data_local;
  nni_sha1_ctx *ctx_local;
  
  local_28 = (uint8_t *)data;
  msg = (uint8_t *)length;
  if (length != 0) {
    while (msg != (uint8_t *)0x0) {
      uVar1 = *local_28;
      iVar2 = ctx->idx;
      ctx->idx = iVar2 + 1;
      ctx->blk[iVar2] = uVar1;
      ctx->len = ctx->len + 8;
      if (ctx->idx == 0x40) {
        nni_sha1_process(ctx);
      }
      local_28 = local_28 + 1;
      msg = msg + -1;
    }
  }
  return;
}

Assistant:

void
nni_sha1_update(nni_sha1_ctx *ctx, const void *data, size_t length)
{
	const uint8_t *msg = data;

	if (!length) {
		return;
	}

	while (length--) {
		// memcpy might be faster...
		ctx->blk[ctx->idx++] = (*msg & 0xFF);
		ctx->len += 8;

		if (ctx->idx == 64) {
			// This will reset the index back to zero.
			nni_sha1_process(ctx);
		}

		msg++;
	}
}